

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

group * clipp::operator_(group *__return_storage_ptr__,parameter *a,group *b)

{
  _Manager_type p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  __type _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  parameter local_1b0;
  group local_b0;
  group local_68;
  
  if (b->scoped_ == false) {
    bVar3 = group::blocking(b);
    if ((((!bVar3) && (b->exclusive_ == false)) &&
        ((b->super_token<clipp::group>).repeatable_ == false)) && (b->joinable_ == false)) {
      if ((b->super_token<clipp::group>).doc_._M_string_length != 0) {
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )b,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)a);
        if (!_Var4) goto LAB_0012c0ed;
      }
      std::
      vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
      ::_M_emplace_aux<clipp::parameter>
                (&b->children_,
                 (b->children_).
                 super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,a);
      bVar3 = false;
      goto LAB_0012c37b;
    }
  }
LAB_0012c0ed:
  local_1b0.super_token<clipp::parameter>.doc_._M_dataplus._M_p =
       (pointer)&local_1b0.super_token<clipp::parameter>.doc_.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(a->super_token<clipp::parameter>).doc_._M_dataplus._M_p;
  paVar2 = &(a->super_token<clipp::parameter>).doc_.field_2;
  if (paVar5 == paVar2) {
    local_1b0.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
    local_1b0.super_token<clipp::parameter>.doc_.field_2._8_8_ =
         *(undefined8 *)((long)&(a->super_token<clipp::parameter>).doc_.field_2 + 8);
  }
  else {
    local_1b0.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
    local_1b0.super_token<clipp::parameter>.doc_._M_dataplus._M_p = (pointer)paVar5;
  }
  local_1b0.super_token<clipp::parameter>.doc_._M_string_length =
       (a->super_token<clipp::parameter>).doc_._M_string_length;
  (a->super_token<clipp::parameter>).doc_._M_dataplus._M_p = (pointer)paVar2;
  (a->super_token<clipp::parameter>).doc_._M_string_length = 0;
  (a->super_token<clipp::parameter>).doc_.field_2._M_local_buf[0] = '\0';
  local_1b0.super_token<clipp::parameter>.repeatable_ =
       (a->super_token<clipp::parameter>).repeatable_;
  local_1b0.super_token<clipp::parameter>.blocking_ = (a->super_token<clipp::parameter>).blocking_;
  local_1b0.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (a->super_action_provider<clipp::parameter>).argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b0.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (a->super_action_provider<clipp::parameter>).argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1b0.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (a->super_action_provider<clipp::parameter>).argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (a->super_action_provider<clipp::parameter>).repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1b0.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (a->super_action_provider<clipp::parameter>).repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1b0.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (a->super_action_provider<clipp::parameter>).repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (a->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (a->super_action_provider<clipp::parameter>).missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1b0.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (a->super_action_provider<clipp::parameter>).missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1b0.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (a->super_action_provider<clipp::parameter>).missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (a->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (a->super_action_provider<clipp::parameter>).blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1b0.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (a->super_action_provider<clipp::parameter>).blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1b0.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (a->super_action_provider<clipp::parameter>).blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (a->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (a->super_action_provider<clipp::parameter>).conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1b0.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (a->super_action_provider<clipp::parameter>).conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1b0.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (a->super_action_provider<clipp::parameter>).conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (a->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (a->flags_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b0.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (a->flags_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1b0.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (a->flags_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.matcher_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1b0.matcher_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1b0.matcher_.super__Function_base._M_functor._8_8_ = 0;
  local_1b0.matcher_._M_invoker = (a->matcher_)._M_invoker;
  p_Var1 = (a->matcher_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_1b0.matcher_.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(a->matcher_).super__Function_base._M_functor;
    local_1b0.matcher_.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(a->matcher_).super__Function_base._M_functor + 8);
    (a->matcher_).super__Function_base._M_manager = (_Manager_type)0x0;
    (a->matcher_)._M_invoker = (_Invoker_type)0x0;
    local_1b0.matcher_.super__Function_base._M_manager = p_Var1;
  }
  local_1b0.label_._M_dataplus._M_p = (pointer)&local_1b0.label_.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(a->label_)._M_dataplus._M_p;
  paVar5 = &(a->label_).field_2;
  if (paVar2 == paVar5) {
    local_1b0.label_.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_1b0.label_.field_2._8_8_ = *(undefined8 *)((long)&(a->label_).field_2 + 8);
  }
  else {
    local_1b0.label_.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_1b0.label_._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1b0.label_._M_string_length = (a->label_)._M_string_length;
  (a->label_)._M_dataplus._M_p = (pointer)paVar5;
  (a->label_)._M_string_length = 0;
  (a->label_).field_2._M_local_buf[0] = '\0';
  local_1b0.required_ = a->required_;
  local_1b0.greedy_ = a->greedy_;
  local_b0.super_token<clipp::group>.doc_._M_dataplus._M_p =
       (pointer)&local_b0.super_token<clipp::group>.doc_.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(b->super_token<clipp::group>).doc_._M_dataplus._M_p;
  paVar2 = &(b->super_token<clipp::group>).doc_.field_2;
  if (paVar5 == paVar2) {
    local_b0.super_token<clipp::group>.doc_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
    local_b0.super_token<clipp::group>.doc_.field_2._8_8_ =
         *(undefined8 *)((long)&(b->super_token<clipp::group>).doc_.field_2 + 8);
  }
  else {
    local_b0.super_token<clipp::group>.doc_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
    local_b0.super_token<clipp::group>.doc_._M_dataplus._M_p = (pointer)paVar5;
  }
  local_b0.super_token<clipp::group>.doc_._M_string_length =
       (b->super_token<clipp::group>).doc_._M_string_length;
  (b->super_token<clipp::group>).doc_._M_dataplus._M_p = (pointer)paVar2;
  (b->super_token<clipp::group>).doc_._M_string_length = 0;
  (b->super_token<clipp::group>).doc_.field_2._M_local_buf[0] = '\0';
  local_b0.super_token<clipp::group>.repeatable_ = (b->super_token<clipp::group>).repeatable_;
  local_b0.super_token<clipp::group>.blocking_ = (b->super_token<clipp::group>).blocking_;
  local_b0.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (b->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b0.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (b->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b0.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (b->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.scoped_ = b->scoped_;
  local_b0.exclusive_ = b->exclusive_;
  local_b0.joinable_ = b->joinable_;
  b = &local_68;
  group::group<clipp::group>(b,&local_1b0,&local_b0);
  local_68.scoped_ = false;
  bVar3 = true;
LAB_0012c37b:
  group::group(__return_storage_ptr__,b);
  if (bVar3) {
    std::
    vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
    ::~vector(&local_68.children_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.super_token<clipp::group>.doc_._M_dataplus._M_p !=
        &local_68.super_token<clipp::group>.doc_.field_2) {
      operator_delete(local_68.super_token<clipp::group>.doc_._M_dataplus._M_p);
    }
    std::
    vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
    ::~vector(&local_b0.children_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.super_token<clipp::group>.doc_._M_dataplus._M_p !=
        &local_b0.super_token<clipp::group>.doc_.field_2) {
      operator_delete(local_b0.super_token<clipp::group>.doc_._M_dataplus._M_p);
    }
    parameter::~parameter(&local_1b0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline group
operator , (parameter a, group b)
{
    return !b.scoped() && !b.blocking() && !b.exclusive() && !b.repeatable()
        && !b.joinable() && (b.doc().empty() || b.doc() == a.doc())
       ? b.push_front(std::move(a))
       : group{std::move(a), std::move(b)}.scoped(false);
}